

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenLookupByKey
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,FieldDef *key_field,
          string *bb_var_name,char *num)

{
  Type type;
  string sStack_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  Type local_58;
  
  local_58.base_type = (key_field->value).type.base_type;
  local_58.element = (key_field->value).type.element;
  local_58.struct_def = (key_field->value).type.struct_def;
  local_58.enum_def = (key_field->value).type.enum_def;
  local_58.fixed_length = (key_field->value).type.fixed_length;
  local_58._26_6_ = *(undefined6 *)&(key_field->value).type.field_0x1a;
  std::__cxx11::string::string((string *)&local_78,(string *)bb_var_name);
  ByteBufferGetter(&local_d8,this,&local_58,&local_78);
  std::operator+(&local_b8,&local_d8,"(");
  GenOffsetGetter_abi_cxx11_(&sStack_f8,this,key_field,num);
  std::operator+(&local_98,&local_b8,&sStack_f8);
  std::operator+(__return_storage_ptr__,&local_98,")");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&sStack_f8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string GenLookupByKey(flatbuffers::FieldDef *key_field,
                             const std::string &bb_var_name,
                             const char *num = nullptr) const {
    auto type = key_field->value.type;
    return ByteBufferGetter(type, bb_var_name) + "(" +
           GenOffsetGetter(key_field, num) + ")";
  }